

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O3

size_t __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::insert
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *this,size_t outerIndex,
          size_t innerIndex,double value)

{
  int *piVar1;
  pointer piVar2;
  bool bVar3;
  size_t sVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  size_t insertionIndex;
  size_t local_40;
  double local_38;
  double local_30;
  
  uVar8 = this->m_allocatedSize;
  local_38 = value;
  sVar4 = VectorDynSize::size(&this->m_values);
  if (uVar8 <= sVar4) {
    sVar4 = VectorDynSize::size(&this->m_values);
    reserve(this,sVar4 + 10);
  }
  local_40 = 0;
  bVar3 = valueIndexForOuterAndInnerIndices(this,outerIndex,innerIndex,&local_40);
  if (!bVar3) {
    sVar4 = VectorDynSize::size(&this->m_values);
    VectorDynSize::resize(&this->m_values,sVar4 + 1);
    std::vector<int,_std::allocator<int>_>::resize
              (&this->m_innerIndices,
               ((long)(this->m_innerIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->m_innerIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) + 1);
    sVar4 = VectorDynSize::size(&this->m_values);
    uVar8 = sVar4 - 1;
    if (local_40 < sVar4 - 1) {
      do {
        sVar4 = uVar8 - 1;
        pdVar5 = VectorDynSize::operator()(&this->m_values,sVar4);
        local_30 = *pdVar5;
        pdVar5 = VectorDynSize::operator()(&this->m_values,uVar8);
        *pdVar5 = local_30;
        piVar2 = (this->m_innerIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar2[uVar8] = piVar2[uVar8 - 1];
        uVar8 = sVar4;
      } while (local_40 < sVar4);
    }
    pdVar5 = VectorDynSize::operator()(&this->m_values,local_40);
    *pdVar5 = local_38;
    (this->m_innerIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[local_40] = (int)innerIndex;
    piVar2 = (this->m_outerStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = (long)(this->m_outerStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
    if (outerIndex < lVar6 - 1U) {
      lVar7 = outerIndex + 1;
      do {
        piVar1 = piVar2 + lVar7;
        *piVar1 = *piVar1 + 1;
        lVar7 = lVar7 + 1;
      } while (lVar6 != lVar7);
    }
  }
  return local_40;
}

Assistant:

std::size_t SparseMatrix<ordering>::insert(std::size_t outerIndex, std::size_t innerIndex, double value)
    {
        //first: check if there is space in the arrays
        if (m_allocatedSize <= m_values.size()) {
            reserve(m_values.size() + 10);
        }

        //find insertion position
        std::size_t insertionIndex = 0;
        if (valueIndexForOuterAndInnerIndices(outerIndex, innerIndex, insertionIndex)) {
            //???: what if the element exists alredy in the matrix?
            return insertionIndex;
        }

        //I found the index. Now I have to shift to the right the values and inner elements
        m_values.resize(m_values.size() + 1);
        m_innerIndices.resize(m_innerIndices.size() + 1);

        for (std::size_t i = m_values.size() - 1; i > insertionIndex && i > 0; --i) {
            m_values(i) = m_values(i - 1);
            m_innerIndices[i] = m_innerIndices[i - 1];
        }

        m_values(insertionIndex) = value;
        m_innerIndices[insertionIndex] = innerIndex;
        //update row NNZ
        for (std::size_t nextOuterIndex = outerIndex; nextOuterIndex < m_outerStarts.size() - 1; ++nextOuterIndex) {
            m_outerStarts[nextOuterIndex + 1]++;
        }

        return insertionIndex;
    }